

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

bool __thiscall Assimp::XGLImporter::SkipToText(XGLImporter *this)

{
  int iVar1;
  char *__end;
  bool bVar2;
  string local_50;
  
  iVar1 = (*((this->m_reader).
             super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 == '\0') {
    bVar2 = false;
  }
  else {
    do {
      iVar1 = (*((this->m_reader).
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_IIrrXMLReader[3])();
      bVar2 = iVar1 == 3;
      if (bVar2) {
        return bVar2;
      }
      iVar1 = (*((this->m_reader).
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_IIrrXMLReader[3])();
      if ((iVar1 == 1) ||
         (iVar1 = (*((this->m_reader).
                     super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_vptr_IIrrXMLReader[3])(), iVar1 == 2)) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "expected text contents but found another element (or element end)","");
        LogFunctions<Assimp::XGLImporter>::ThrowException(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      iVar1 = (*((this->m_reader).
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return bVar2;
}

Assistant:

bool XGLImporter::SkipToText()
{
    while(m_reader->read()) {
        if (m_reader->getNodeType() == EXN_TEXT) {
            return true;
        }
        else if (m_reader->getNodeType() == EXN_ELEMENT || m_reader->getNodeType() == EXN_ELEMENT_END) {
            ThrowException("expected text contents but found another element (or element end)");
        }
    }
    return false;
}